

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.h
# Opt level: O3

bool __thiscall
basisu::etc_block::get_block_colors
          (etc_block *this,color_rgba *pBlock_colors,uint32_t subblock_index)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  byte bVar12;
  byte bVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint uVar16;
  uint uVar17;
  uint8_t uVar18;
  ushort packed_color5;
  uint8_t uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint8_t uVar26;
  uint uVar27;
  undefined1 in_XMM2 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  color_rgba b;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_40 [4];
  
  bVar10 = (this->field_0).m_bytes[0];
  if (((this->field_0).m_bytes[3] & 2) == 0) {
    if (subblock_index == 0) {
      bVar10 = bVar10 >> 4;
      bVar12 = (this->field_0).m_bytes[1] >> 4;
      bVar13 = (this->field_0).m_bytes[2] >> 4;
    }
    else {
      bVar10 = bVar10 & 0xf;
      bVar12 = (this->field_0).m_bytes[1] & 0xf;
      bVar13 = (this->field_0).m_bytes[2] & 0xf;
    }
    local_40[0].field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
         unpack_color4(CONCAT11(bVar10,bVar12 << 4 | bVar13),true,0xff);
  }
  else {
    packed_color5 =
         (bVar10 & 0xf8) << 7 |
         (ushort)((this->field_0).m_bytes[2] >> 3) + ((this->field_0).m_bytes[1] & 0xfff8) * 4;
    if (subblock_index == 0) {
      unpack_color5((color_rgba *)&local_40[0].field_1,packed_color5,true);
      goto LAB_00204824;
    }
    unpack_color5((color_rgba *)&local_40[0].field_1,packed_color5,
                  (bVar10 & 7) << 6 |
                  ((this->field_0).m_bytes[2] & 7) + ((this->field_0).m_bytes[1] & 7) * 8,true,0xff)
    ;
  }
  if (1 < subblock_index) {
    __assert_fail("subblock_id < 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.h"
                  ,0xb8,"uint32_t basisu::etc_block::get_inten_table(uint32_t) const");
  }
LAB_00204824:
  uVar23 = (ulong)(((this->field_0).m_bytes[3] >> (subblock_index == 0) * '\x03' + 2 & 7) << 4);
  uVar22 = (uint)local_40[0] & 0xff;
  iVar5 = *(int *)(g_etc1_inten_tables + uVar23);
  uVar1 = iVar5 + uVar22;
  uVar18 = 0xff;
  if (uVar1 < 0xff) {
    uVar18 = (uint8_t)uVar1;
  }
  uVar26 = '\0';
  if ((int)uVar1 < 0) {
    uVar18 = uVar26;
  }
  uVar25 = (uint)local_40[0] >> 8 & 0xff;
  uVar2 = iVar5 + uVar25;
  uVar15 = 0xff;
  if (uVar2 < 0xff) {
    uVar15 = (uint8_t)uVar2;
  }
  uVar14 = '\0';
  if ((int)uVar2 < 0) {
    uVar15 = uVar14;
  }
  uVar27 = (uint)local_40[0] >> 0x10 & 0xff;
  uVar21 = iVar5 + uVar27;
  uVar20 = 0xff;
  if (uVar21 < 0xff) {
    uVar20 = uVar21;
  }
  uVar19 = (uint8_t)uVar20;
  if ((int)uVar21 < 0) {
    uVar19 = uVar26;
  }
  iVar5 = *(int *)(g_etc1_inten_tables + uVar23 + 4);
  (pBlock_colors->field_0).m_comps[0] = uVar18;
  (pBlock_colors->field_0).m_comps[1] = uVar15;
  (pBlock_colors->field_0).m_comps[2] = uVar19;
  uVar20 = iVar5 + uVar22;
  uVar18 = 0xff;
  if (uVar20 < 0xff) {
    uVar18 = (uint8_t)uVar20;
  }
  if ((int)uVar20 < 0) {
    uVar18 = uVar14;
  }
  (pBlock_colors->field_0).m_comps[3] = 0xff;
  pBlock_colors[1].field_0.m_comps[0] = uVar18;
  pBlock_colors[1].field_0.m_comps[3] = 0xff;
  uVar3 = iVar5 + uVar25;
  uVar18 = 0xff;
  if (uVar3 < 0xff) {
    uVar18 = (uint8_t)uVar3;
  }
  if ((int)uVar3 < 0) {
    uVar18 = uVar14;
  }
  uVar24 = iVar5 + uVar27;
  uVar16 = 0xff;
  if (uVar24 < 0xff) {
    uVar16 = uVar24;
  }
  pBlock_colors[2].field_0.m_comps[3] = 0xff;
  uVar15 = (uint8_t)uVar16;
  if ((int)uVar24 < 0) {
    uVar15 = uVar26;
  }
  pBlock_colors[1].field_0.m_comps[1] = uVar18;
  pBlock_colors[1].field_0.m_comps[2] = uVar15;
  iVar5 = *(int *)(g_etc1_inten_tables + uVar23 + 8);
  uVar16 = iVar5 + uVar22;
  uVar18 = 0xff;
  if (uVar16 < 0xff) {
    uVar18 = (uint8_t)uVar16;
  }
  if ((int)uVar16 < 0) {
    uVar18 = uVar14;
  }
  uVar4 = iVar5 + uVar25;
  uVar15 = 0xff;
  if (uVar4 < 0xff) {
    uVar15 = (uint8_t)uVar4;
  }
  if ((int)uVar4 < 0) {
    uVar15 = uVar14;
  }
  uVar17 = iVar5 + uVar27;
  uVar11 = 0xff;
  if (uVar17 < 0xff) {
    uVar11 = uVar17;
  }
  pBlock_colors[2].field_0.m_comps[0] = uVar18;
  uVar18 = (uint8_t)uVar11;
  if ((int)uVar17 < 0) {
    uVar18 = uVar26;
  }
  pBlock_colors[2].field_0.m_comps[1] = uVar15;
  pBlock_colors[2].field_0.m_comps[2] = uVar18;
  iVar5 = *(int *)(g_etc1_inten_tables + uVar23 + 0xc);
  uVar22 = uVar22 + iVar5;
  uVar11 = 0xff;
  if (uVar22 < 0xff) {
    uVar11 = uVar22;
  }
  uVar18 = (uint8_t)uVar11;
  if ((int)uVar22 < 0) {
    uVar18 = '\0';
  }
  uVar25 = uVar25 + iVar5;
  uVar11 = 0xff;
  if (uVar25 < 0xff) {
    uVar11 = uVar25;
  }
  uVar26 = (uint8_t)uVar11;
  if ((int)uVar25 < 0) {
    uVar26 = '\0';
  }
  uVar27 = iVar5 + uVar27;
  uVar11 = 0xff;
  if (uVar27 < 0xff) {
    uVar11 = uVar27;
  }
  auVar28 = pmovsxwd(in_XMM2,0x100010001000100);
  uVar6 = auVar28._0_4_;
  uVar7 = auVar28._4_4_;
  uVar8 = auVar28._8_4_;
  uVar9 = auVar28._12_4_;
  auVar29._0_4_ = -(uint)(((uVar4 < uVar6) * uVar6 | (uVar4 >= uVar6) * uVar4) == uVar4);
  auVar29._4_4_ = -(uint)(((uVar16 < uVar7) * uVar7 | (uVar16 >= uVar7) * uVar16) == uVar16);
  auVar29._8_4_ = -(uint)(((uVar24 < uVar8) * uVar8 | (uVar24 >= uVar8) * uVar24) == uVar24);
  auVar29._12_4_ = -(uint)(((uVar3 < uVar9) * uVar9 | (uVar3 >= uVar9) * uVar3) == uVar3);
  auVar28._0_4_ = -(uint)(((uVar6 < uVar27) * uVar27 | (uVar6 >= uVar27) * uVar6) == uVar27);
  auVar28._4_4_ = -(uint)(((uVar7 < uVar25) * uVar25 | (uVar7 >= uVar25) * uVar7) == uVar25);
  auVar28._8_4_ = -(uint)(((uVar8 < uVar22) * uVar22 | (uVar8 >= uVar22) * uVar8) == uVar22);
  auVar28._12_4_ = -(uint)(((uVar9 < uVar17) * uVar17 | (uVar9 >= uVar17) * uVar9) == uVar17);
  auVar28 = packssdw(auVar28,auVar29);
  uVar15 = (uint8_t)uVar11;
  if ((int)uVar27 < 0) {
    uVar15 = '\0';
  }
  pBlock_colors[3].field_0.m_comps[0] = uVar18;
  pBlock_colors[3].field_0.m_comps[1] = uVar26;
  pBlock_colors[3].field_0.m_comps[2] = uVar15;
  pBlock_colors[3].field_0.m_comps[3] = 0xff;
  return (0xff < (uVar21 | uVar20 | uVar2) || 0xff < uVar1) ||
         ((((((((((((((((auVar28 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar28 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar28 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar28 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar28 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar28 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar28 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar28 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar28 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar28 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar28 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar28 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar28[0xf] < '\0'
         );
}

Assistant:

bool get_block_colors(color_rgba* pBlock_colors, uint32_t subblock_index) const
		{
			color_rgba b;

			if (get_diff_bit())
			{
				if (subblock_index)
					unpack_color5(b, get_base5_color(), get_delta3_color(), true);
				else
					unpack_color5(b, get_base5_color(), true);
			}
			else
			{
				b = unpack_color4(get_base4_color(subblock_index), true);
			}

			const int* pInten_table = g_etc1_inten_tables[get_inten_table(subblock_index)];

			bool dc = false;

			pBlock_colors[0].set(clamp255(b.r + pInten_table[0], dc), clamp255(b.g + pInten_table[0], dc), clamp255(b.b + pInten_table[0], dc), 255);
			pBlock_colors[1].set(clamp255(b.r + pInten_table[1], dc), clamp255(b.g + pInten_table[1], dc), clamp255(b.b + pInten_table[1], dc), 255);
			pBlock_colors[2].set(clamp255(b.r + pInten_table[2], dc), clamp255(b.g + pInten_table[2], dc), clamp255(b.b + pInten_table[2], dc), 255);
			pBlock_colors[3].set(clamp255(b.r + pInten_table[3], dc), clamp255(b.g + pInten_table[3], dc), clamp255(b.b + pInten_table[3], dc), 255);

			return dc;
		}